

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

attr_list ContactWriter(SstStream Stream,char *Filename,SstParams Params,SMPI_Comm comm,
                       CMConnection *conn_p,void **WriterFileID_p)

{
  CPNetworkInfoFunc p_Var1;
  char *pcVar2;
  attr_list p_Var3;
  size_t sVar4;
  char *pcVar5;
  FILE *__stream;
  ushort **ppuVar6;
  CMConnection p_Var7;
  uint uVar8;
  SstStream Stream_00;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  stat Buf;
  uint local_2890;
  int local_288c;
  SstStream local_2888;
  void **local_2880;
  char *local_2878;
  CMConnection *local_2870;
  undefined7 local_2868;
  undefined1 uStack_2861;
  undefined7 uStack_2860;
  char local_2839;
  stat local_2838 [71];
  
  local_288c = 0;
  if (Stream->Rank != 0) {
    SMPI_Bcast(&local_288c,1,SMPI_INT,0,Stream->mpiComm);
    iVar9 = local_288c;
    if ((long)local_288c == 0) {
      return (attr_list)0x0;
    }
    pcVar2 = (char *)malloc((long)local_288c);
    SMPI_Bcast(pcVar2,iVar9,SMPI_CHAR,0,Stream->mpiComm);
    p_Var3 = (attr_list)attr_list_from_string(pcVar2);
    goto LAB_0073998b;
  }
  local_2870 = conn_p;
  if (Stream->RegistrationMethod == SstRegisterScreen) {
    fprintf(_stdout,
            "Please enter the contact information associated with SST input stream \"%s\":\n",
            Filename);
    pcVar5 = fgets((char *)local_2838,0x2800,_stdin);
    if (pcVar5 == (char *)0x0) {
      fwrite("Read from stdin failed, exiting\n",0x20,1,_stdout);
      exit(1);
    }
    ppuVar6 = __ctype_b_loc();
    pcVar5 = &local_2839;
    do {
      pcVar2 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
    } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar2 * 2 + 1) & 0x20) != 0);
    pcVar5 = strdup(pcVar5);
    Stream_00 = Stream;
  }
  else if (Stream->RegistrationMethod == SstRegisterFile) {
    uVar8 = Params->OpenTimeoutSecs;
    local_2880 = WriterFileID_p;
    sVar4 = strlen(Filename);
    pcVar5 = (char *)malloc(sVar4 + 5);
    lVar11 = (long)(int)uVar8 * 1000;
    local_2878 = Filename;
    snprintf(pcVar5,sVar4 + 5,"%s.sst",Filename);
    local_2888 = Stream;
    CP_verbose(Stream,PerRankVerbose,"Looking for writer contact in file %s, with timeout %d secs\n"
               ,pcVar5,(ulong)uVar8);
    lVar10 = 5000;
    local_2890 = 0;
    while( true ) {
      __stream = fopen(pcVar5,"r");
      while (__stream == (FILE *)0x0) {
        usleep(100000);
        if (lVar10 == 100) {
          fprintf(_stderr,
                  "ADIOS2 SST Engine waiting for contact information file %s to be created\n",
                  local_2878);
        }
        if (lVar11 < 0x65) {
          free(pcVar5);
          pcVar5 = (char *)0x0;
          Stream_00 = local_2888;
          WriterFileID_p = local_2880;
          goto LAB_00739878;
        }
        __stream = fopen(pcVar5,"r");
        lVar10 = lVar10 + -100;
        lVar11 = lVar11 + -100;
      }
      iVar9 = fileno(__stream);
      fstat(iVar9,local_2838);
      if (((uint)local_2838[0].st_size != 0) || (3 < local_2890)) break;
      local_2890 = local_2890 + 1;
      usleep(100000);
    }
    if ((uint)local_2838[0].st_size < 0xf) {
      bVar12 = false;
      WriterFileID_p = local_2880;
      uVar8 = (uint)local_2838[0].st_size;
    }
    else {
      sVar4 = fread(&local_2868,0xf,1,__stream);
      WriterFileID_p = local_2880;
      if (sVar4 != 1) {
        ContactWriter_cold_1();
      }
      uVar8 = (uint)local_2838[0].st_size - 0xf;
      bVar12 = (CONCAT71(uStack_2860,uStack_2861) == 0xa3076205453532d &&
               CONCAT17(uStack_2861,local_2868) == 0x2d32534f49444123) && sVar4 == 1;
    }
    if (bVar12) {
      free(pcVar5);
      pcVar5 = (char *)calloc(1,(long)(int)(uVar8 + 1));
      sVar4 = fread(pcVar5,(long)(int)uVar8,1,__stream);
      if (sVar4 == 1) {
        fclose(__stream);
        Stream_00 = local_2888;
        goto LAB_00739878;
      }
      ContactWriter_cold_3();
    }
    else {
      ContactWriter_cold_2();
    }
    pcVar5 = (char *)0x0;
    Stream_00 = local_2888;
  }
  else {
    pcVar5 = (char *)0x0;
    Stream_00 = Stream;
  }
LAB_00739878:
  iVar9 = 0;
  if (pcVar5 == (char *)0x0) {
    p_Var7 = (CMConnection)0x0;
    pcVar2 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar5);
    pcVar2 = (char *)malloc(sVar4 + 1);
    __isoc99_sscanf(pcVar5,"%p:%s",WriterFileID_p);
    free(pcVar5);
    p_Var1 = globalNetinfoCallback;
    if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
      pcVar5 = CP_GetContactString(Stream_00,(attr_list)0x0);
      (*p_Var1)(1,pcVar5,IPDiagString);
      (*globalNetinfoCallback)(2,pcVar2,(char *)0x0);
    }
    p_Var3 = (attr_list)attr_list_from_string(pcVar2);
    p_Var7 = Tunneling_get_conn(Stream_00->CPInfo->SharedCM->cm,p_Var3);
    free_attr_list(p_Var3);
  }
  if (p_Var7 == (CMConnection)0x0) {
    p_Var7 = (CMConnection)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    iVar9 = (int)sVar4 + 1;
  }
  *local_2870 = p_Var7;
  p_Var3 = (attr_list)0x0;
  local_288c = iVar9;
  SMPI_Bcast(&local_288c,1,SMPI_INT,0,Stream_00->mpiComm);
  if (local_288c != 0) {
    SMPI_Bcast(pcVar2,local_288c,SMPI_CHAR,0,Stream_00->mpiComm);
    p_Var3 = (attr_list)attr_list_from_string(pcVar2);
  }
  if (pcVar2 == (char *)0x0) {
    return p_Var3;
  }
LAB_0073998b:
  free(pcVar2);
  return p_Var3;
}

Assistant:

attr_list ContactWriter(SstStream Stream, char *Filename, SstParams Params, SMPI_Comm comm,
                        CMConnection *conn_p, void **WriterFileID_p)
{
    int DataSize = 0;
    attr_list RetVal = NULL;

    if (Stream->Rank == 0)
    {
        char *Writer0Contact = readContactInfo(Filename, Stream, Params->OpenTimeoutSecs);
        char *CMContactString = NULL;
        CMConnection conn = NULL;
        attr_list WriterRank0Contact;

        if (Writer0Contact)
        {

            CMContactString = malloc(strlen(Writer0Contact) + 1); /* +1 for null terminator */
            sscanf(Writer0Contact, "%p:%s", WriterFileID_p, CMContactString);
            //        printf("Writer contact info is fileID %p, contact info
            //        %s\n",
            //               WriterFileID, CMContactString);
            free(Writer0Contact);

            if (globalNetinfoCallback)
            {
                (globalNetinfoCallback)(1, CP_GetContactString(Stream, NULL), IPDiagString);
                (globalNetinfoCallback)(2, CMContactString, NULL);
            }
            WriterRank0Contact = attr_list_from_string(CMContactString);
            conn = Tunneling_get_conn(Stream->CPInfo->SharedCM->cm, WriterRank0Contact);
            free_attr_list(WriterRank0Contact);
        }
        if (conn)
        {
            DataSize = (int)strlen(CMContactString) + 1;
            *conn_p = conn;
        }
        else
        {
            DataSize = 0;
            *conn_p = NULL;
        }
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            SMPI_Bcast(CMContactString, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(CMContactString);
        }
        if (CMContactString)
            free(CMContactString);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        if (DataSize != 0)
        {
            char *Buffer = malloc(DataSize);
            SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
            RetVal = attr_list_from_string(Buffer);
            free(Buffer);
        }
    }
    return RetVal;
}